

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::draw_elements_base_vertex
               (NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  NotSupportedError *this;
  allocator<char> local_45;
  GLfloat vertices [1];
  string local_40;
  GLuint fbo;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar1) {
    fbo = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GL_INVALID_ENUM is generated if mode is not an accepted value.",
               &local_45);
    NegativeTestContext::beginSection(ctx,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    glu::CallLogWrapper::glDrawElementsBaseVertex
              (&ctx->super_CallLogWrapper,0xffffffff,1,0x1405,vertices,1);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "GL_INVALID_ENUM is generated if type is not one of the accepted values.",&local_45);
    NegativeTestContext::beginSection(ctx,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    glu::CallLogWrapper::glDrawElementsBaseVertex
              (&ctx->super_CallLogWrapper,0,1,0xffffffff,vertices,1);
    NegativeTestContext::expectError(ctx,0x500);
    glu::CallLogWrapper::glDrawElementsBaseVertex(&ctx->super_CallLogWrapper,0,1,0x1406,vertices,1);
    NegativeTestContext::expectError(ctx,0x500);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GL_INVALID_VALUE is generated if count is negative.",&local_45);
    NegativeTestContext::beginSection(ctx,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    glu::CallLogWrapper::glDrawElementsBaseVertex(&ctx->super_CallLogWrapper,0,-1,0x1405,vertices,1)
    ;
    NegativeTestContext::expectError(ctx,0x501);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete."
               ,&local_45);
    NegativeTestContext::beginSection(ctx,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    glu::CallLogWrapper::glGenFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
    glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,fbo);
    glu::CallLogWrapper::glCheckFramebufferStatus(&ctx->super_CallLogWrapper,0x8d40);
    glu::CallLogWrapper::glDrawElementsBaseVertex(&ctx->super_CallLogWrapper,0,1,0x1405,vertices,1);
    NegativeTestContext::expectError(ctx,0x506);
    glu::CallLogWrapper::glBindFramebuffer(&ctx->super_CallLogWrapper,0x8d40,0);
    glu::CallLogWrapper::glDeleteFramebuffers(&ctx->super_CallLogWrapper,1,&fbo);
    NegativeTestContext::endSection(ctx);
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this,"This test requires a 3.2 context or higher context version.",
             "contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2))",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeVertexArrayApiTests.cpp"
             ,0x29f);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void draw_elements_base_vertex (NegativeTestContext& ctx)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)), "This test requires a 3.2 context or higher context version.");

	GLuint				fbo = 0;
	GLfloat				vertices[1];

	ctx.beginSection("GL_INVALID_ENUM is generated if mode is not an accepted value.");
	ctx.glDrawElementsBaseVertex(-1, 1, GL_UNSIGNED_INT, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if type is not one of the accepted values.");
	ctx.glDrawElementsBaseVertex(GL_POINTS, 1, -1, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glDrawElementsBaseVertex(GL_POINTS, 1, GL_FLOAT, vertices, 1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if count is negative.");
	ctx.glDrawElementsBaseVertex(GL_POINTS, -1, GL_UNSIGNED_INT, vertices, 1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_FRAMEBUFFER_OPERATION is generated if the currently bound framebuffer is not framebuffer complete.");
	ctx.glGenFramebuffers(1, &fbo);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, fbo);
	ctx.glCheckFramebufferStatus(GL_FRAMEBUFFER);
	ctx.glDrawElementsBaseVertex(GL_POINTS, 1, GL_UNSIGNED_INT, vertices, 1);
	ctx.expectError(GL_INVALID_FRAMEBUFFER_OPERATION);
	ctx.glBindFramebuffer(GL_FRAMEBUFFER, 0);
	ctx.glDeleteFramebuffers(1, &fbo);
	ctx.endSection();
}